

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

string * stage_to_string_abi_cxx11_(string *__return_storage_ptr__,VkShaderStageFlagBits stage)

{
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d;
  allocator local_1c;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  VkShaderStageFlagBits local_14;
  string *psStack_10;
  VkShaderStageFlagBits stage_local;
  
  local_14 = stage;
  psStack_10 = __return_storage_ptr__;
  if (stage == VK_SHADER_STAGE_VERTEX_BIT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"vert",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"tesc",&local_16);
    std::allocator<char>::~allocator((allocator<char> *)&local_16);
  }
  else if (stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"tese",&local_17);
    std::allocator<char>::~allocator((allocator<char> *)&local_17);
  }
  else if (stage == VK_SHADER_STAGE_GEOMETRY_BIT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"geom",&local_18);
    std::allocator<char>::~allocator((allocator<char> *)&local_18);
  }
  else if (stage == VK_SHADER_STAGE_FRAGMENT_BIT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"frag",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (stage == VK_SHADER_STAGE_COMPUTE_BIT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"comp",&local_1a);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  }
  else if (stage == VK_SHADER_STAGE_TASK_BIT_EXT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"task",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (stage == VK_SHADER_STAGE_MESH_BIT_EXT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"mesh",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
  }
  else if (stage == VK_SHADER_STAGE_RAYGEN_BIT_KHR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"rgen",&local_1b);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  }
  else if (stage == VK_SHADER_STAGE_ANY_HIT_BIT_KHR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"rahit",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else if (stage == VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"rchit",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  else if (stage == VK_SHADER_STAGE_MISS_BIT_KHR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"rmiss",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else if (stage == VK_SHADER_STAGE_INTERSECTION_BIT_KHR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"rint",&local_1c);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c);
  }
  else if (stage == VK_SHADER_STAGE_CALLABLE_BIT_KHR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"rcall",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"????",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
  }
  return __return_storage_ptr__;
}

Assistant:

static string stage_to_string(VkShaderStageFlagBits stage)
{
	switch (stage)
	{
	case VK_SHADER_STAGE_VERTEX_BIT:
		return "vert";
	case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
		return "tesc";
	case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
		return "tese";
	case VK_SHADER_STAGE_GEOMETRY_BIT:
		return "geom";
	case VK_SHADER_STAGE_FRAGMENT_BIT:
		return "frag";
	case VK_SHADER_STAGE_COMPUTE_BIT:
		return "comp";
	case VK_SHADER_STAGE_RAYGEN_BIT_KHR:
		return "rgen";
	case VK_SHADER_STAGE_INTERSECTION_BIT_KHR:
		return "rint";
	case VK_SHADER_STAGE_MISS_BIT_KHR:
		return "rmiss";
	case VK_SHADER_STAGE_ANY_HIT_BIT_KHR:
		return "rahit";
	case VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR:
		return "rchit";
	case VK_SHADER_STAGE_CALLABLE_BIT_KHR:
		return "rcall";
	case VK_SHADER_STAGE_TASK_BIT_EXT:
		return "task";
	case VK_SHADER_STAGE_MESH_BIT_EXT:
		return "mesh";
	default:
		return "????";
	}
}